

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void processOPN(UA_Server *server,UA_Connection *connection,UA_UInt32 channelId,UA_ByteString *msg)

{
  UA_UInt32 *offset_00;
  UA_SecureChannel *pUVar1;
  long lVar2;
  UA_SequenceHeader UVar3;
  UA_StatusCode UVar4;
  UA_StatusCode UVar5;
  UA_StatusCode UVar6;
  UA_StatusCode UVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  undefined1 local_238 [8];
  UA_OpenSecureChannelRequest r;
  UA_OpenSecureChannelResponse p;
  UA_NodeId responseType;
  UA_SecureConversationMessageHeader respHeader;
  size_t offset;
  UA_NodeId requestType;
  undefined8 uStack_98;
  UA_AsymmetricAlgorithmSecurityHeader asymHeader;
  undefined4 local_58 [2];
  UA_SequenceHeader seqHeader;
  undefined1 auStack_48 [8];
  UA_ByteString resp_msg;
  
  iVar8 = 0;
  if (connection->state != UA_CONNECTION_ESTABLISHED) {
    iVar8 = -0x7ffb0000;
  }
  pUVar1 = connection->channel;
  iVar10 = iVar8;
  if (pUVar1 == (UA_SecureChannel *)0x0) {
    iVar10 = -0x7ffb0000;
  }
  if (channelId == 0) {
    iVar10 = iVar8;
  }
  if ((pUVar1 != (UA_SecureChannel *)0x0) && ((pUVar1->securityToken).channelId != channelId)) {
    iVar10 = -0x7ffb0000;
  }
  offset_00 = &respHeader.messageHeader.messageSize;
  respHeader.messageHeader.messageSize = 0;
  respHeader.secureChannelId = 0;
  seqHeader = (UA_SequenceHeader)connection;
  UVar4 = UA_decodeBinary(msg,(size_t *)offset_00,&uStack_98,UA_TRANSPORT + 5);
  UVar5 = UA_decodeBinary(msg,(size_t *)offset_00,local_58,UA_TRANSPORT + 7);
  UVar6 = UA_decodeBinary(msg,(size_t *)offset_00,&offset,UA_TYPES + 0x10);
  UVar7 = UA_decodeBinary(msg,(size_t *)offset_00,local_238,UA_TYPES + 0x61);
  if ((UVar7 == 0 && ((UVar6 == 0 && (UVar5 == 0 && UVar4 == 0)) && iVar10 == 0)) &&
     (requestType._0_4_ == 0x1be)) {
    memset(&r.requestedLifetime,0,0xb8);
    UVar3 = seqHeader;
    Service_OpenSecureChannel
              (server,(UA_Connection *)seqHeader,(UA_OpenSecureChannelRequest *)local_238,
               (UA_OpenSecureChannelResponse *)&r.requestedLifetime);
    deleteMembers_noInit((UA_OpenSecureChannelRequest *)local_238,UA_TYPES + 0x61);
    memset((UA_OpenSecureChannelRequest *)local_238,0,0x98);
    lVar2 = *(long *)((long)UVar3 + 0x30);
    if (lVar2 != 0) {
      *(undefined4 *)(lVar2 + 0xb8) = local_58[0];
      auStack_48 = (undefined1  [8])0x0;
      resp_msg.length = 0;
      iVar8 = (**(code **)((long)UVar3 + 0x58))
                        (UVar3,*(undefined4 *)((long)UVar3 + 8),(UA_ByteString *)auStack_48);
      if (iVar8 == 0) {
        *(int *)(lVar2 + 0xbc) = *(int *)(lVar2 + 0xbc) + 1;
        local_58[0] = *(undefined4 *)(lVar2 + 0xbc);
        pos = (UA_Byte *)(resp_msg.length + 0xc);
        end = (UA_Byte *)(resp_msg.length + (long)auStack_48);
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        encodeBuf = (UA_ByteString *)auStack_48;
        UVar4 = UA_encodeBinaryInternal(&uStack_98,UA_TRANSPORT + 5);
        end = (UA_Byte *)(resp_msg.length + (long)auStack_48);
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        encodeBuf = (UA_ByteString *)auStack_48;
        UVar5 = UA_encodeBinaryInternal(local_58,UA_TRANSPORT + 7);
        p.serverNonce.data._0_2_ = 0;
        stack0xffffffffffffff1c = 0x1c100000000;
        end = (UA_Byte *)(resp_msg.length + (long)auStack_48);
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        encodeBuf = (UA_ByteString *)auStack_48;
        UVar6 = UA_encodeBinaryInternal(&p.serverNonce.data,UA_TYPES + 0x10);
        end = (UA_Byte *)(resp_msg.length + (long)auStack_48);
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        encodeBuf = (UA_ByteString *)auStack_48;
        UVar7 = UA_encodeBinaryInternal(&r.requestedLifetime,UA_TYPES + 0x54);
        UVar3 = seqHeader;
        if (UVar7 != 0 || (UVar6 != 0 || (UVar5 != 0 || UVar4 != 0))) {
          (**(code **)((long)seqHeader + 0x60))(seqHeader,auStack_48);
          deleteMembers_noInit(&r.requestedLifetime,UA_TYPES + 0x54);
          memset(&r.requestedLifetime,0,0xb8);
          deleteMembers_noInit(&uStack_98,UA_TRANSPORT + 5);
          asymHeader.senderCertificate.data = (UA_Byte *)0x0;
          asymHeader.receiverCertificateThumbprint.length = 0;
          asymHeader.securityPolicyUri.data = (UA_Byte *)0x0;
          asymHeader.senderCertificate.length = 0;
          uStack_98 = 0;
          asymHeader.securityPolicyUri.length = 0;
          (**(code **)((long)UVar3 + 0x80))(UVar3);
          return;
        }
        uVar9 = (int)pos - (int)resp_msg.length;
        responseType.identifier._12_4_ = 0x464e504f;
        respHeader.messageHeader.messageTypeAndChunkType = p.serverProtocolVersion;
        pos = (UA_Byte *)resp_msg.length;
        end = (UA_Byte *)(resp_msg.length + (long)auStack_48);
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        encodeBuf = (UA_ByteString *)auStack_48;
        UA_encodeBinaryInternal((void *)((long)&responseType.identifier + 0xc),UA_TRANSPORT + 0xb);
        auStack_48 = (undefined1  [8])(ulong)uVar9;
        (**(code **)((long)seqHeader + 0x68))(seqHeader,(UA_ByteString *)auStack_48);
        deleteMembers_noInit(&r.requestedLifetime,UA_TYPES + 0x54);
        memset(&r.requestedLifetime,0,0xb8);
        deleteMembers_noInit(&uStack_98,UA_TRANSPORT + 5);
        return;
      }
    }
    deleteMembers_noInit(&r.requestedLifetime,UA_TYPES + 0x54);
    memset(&r.requestedLifetime,0,0xb8);
    deleteMembers_noInit(&uStack_98,UA_TRANSPORT + 5);
    asymHeader.senderCertificate.data = (UA_Byte *)0x0;
    asymHeader.receiverCertificateThumbprint.length = 0;
    asymHeader.securityPolicyUri.data = (UA_Byte *)0x0;
    asymHeader.senderCertificate.length = 0;
    uStack_98 = 0;
    asymHeader.securityPolicyUri.length = 0;
    (**(code **)((long)UVar3 + 0x80))(UVar3);
  }
  else {
    deleteMembers_noInit(&uStack_98,UA_TRANSPORT + 5);
    asymHeader.senderCertificate.data = (UA_Byte *)0x0;
    asymHeader.receiverCertificateThumbprint.length = 0;
    asymHeader.securityPolicyUri.data = (UA_Byte *)0x0;
    asymHeader.senderCertificate.length = 0;
    uStack_98 = 0;
    asymHeader.securityPolicyUri.length = 0;
    deleteMembers_noInit(&offset,UA_TYPES + 0x10);
    offset = 0;
    requestType.namespaceIndex = 0;
    requestType._2_2_ = 0;
    requestType.identifierType = UA_NODEIDTYPE_NUMERIC;
    requestType.identifier.string.length = 0;
    deleteMembers_noInit(local_238,UA_TYPES + 0x61);
    memset(local_238,0,0x98);
    (**(code **)((long)seqHeader + 0x80))();
  }
  return;
}

Assistant:

static void
processOPN(UA_Server *server, UA_Connection *connection,
           UA_UInt32 channelId, const UA_ByteString *msg) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    /* Called before HEL */
    if(connection->state != UA_CONNECTION_ESTABLISHED)
        retval = UA_STATUSCODE_BADCOMMUNICATIONERROR;
    /* Opening up a channel with a channelid already set */
    if(!connection->channel && channelId != 0)
        retval = UA_STATUSCODE_BADCOMMUNICATIONERROR;
    /* Renew a channel with the wrong channelid */
    if(connection->channel && channelId != connection->channel->securityToken.channelId)
        retval = UA_STATUSCODE_BADCOMMUNICATIONERROR;

    /* Decode the request */
    UA_AsymmetricAlgorithmSecurityHeader asymHeader;
    UA_SequenceHeader seqHeader;
    UA_NodeId requestType;
    UA_OpenSecureChannelRequest r;
    size_t offset = 0;
    retval |= UA_AsymmetricAlgorithmSecurityHeader_decodeBinary(msg, &offset, &asymHeader);
    retval |= UA_SequenceHeader_decodeBinary(msg, &offset, &seqHeader);
    retval |= UA_NodeId_decodeBinary(msg, &offset, &requestType);
    retval |= UA_OpenSecureChannelRequest_decodeBinary(msg, &offset, &r);

    /* Error occured */
    if(retval != UA_STATUSCODE_GOOD || requestType.identifier.numeric != 446) {
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
        UA_NodeId_deleteMembers(&requestType);
        UA_OpenSecureChannelRequest_deleteMembers(&r);
        connection->close(connection);
        return;
    }

    /* Call the service */
    UA_OpenSecureChannelResponse p;
    UA_OpenSecureChannelResponse_init(&p);
    Service_OpenSecureChannel(server, connection, &r, &p);
    UA_OpenSecureChannelRequest_deleteMembers(&r);

    /* Opening the channel failed */
    UA_SecureChannel *channel = connection->channel;
    if(!channel) {
        UA_OpenSecureChannelResponse_deleteMembers(&p);
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
        connection->close(connection);
        return;
    }

    /* Set the starting sequence number */
    channel->receiveSequenceNumber = seqHeader.sequenceNumber;

    /* Allocate the return message */
    UA_ByteString resp_msg;
    UA_ByteString_init(&resp_msg);
    retval = connection->getSendBuffer(connection, connection->localConf.sendBufferSize, &resp_msg);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_OpenSecureChannelResponse_deleteMembers(&p);
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
        connection->close(connection);
        return;
    }

    /* Encode the message after the secureconversationmessageheader */
    size_t tmpPos = 12; /* skip the header */
    seqHeader.sequenceNumber = UA_atomic_add(&channel->sendSequenceNumber, 1);
    retval |= UA_AsymmetricAlgorithmSecurityHeader_encodeBinary(&asymHeader, &resp_msg, &tmpPos); // just mirror back
    retval |= UA_SequenceHeader_encodeBinary(&seqHeader, &resp_msg, &tmpPos);
    UA_NodeId responseType = UA_NODEID_NUMERIC(0, UA_TYPES[UA_TYPES_OPENSECURECHANNELRESPONSE].binaryEncodingId);
    retval |= UA_NodeId_encodeBinary(&responseType, &resp_msg, &tmpPos);
    retval |= UA_OpenSecureChannelResponse_encodeBinary(&p, &resp_msg, &tmpPos);

    if(retval != UA_STATUSCODE_GOOD) {
        connection->releaseSendBuffer(connection, &resp_msg);
        UA_OpenSecureChannelResponse_deleteMembers(&p);
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
        connection->close(connection);
        return;
    }

    /* Encode the secureconversationmessageheader (cannot fail) and send */
    UA_SecureConversationMessageHeader respHeader;
    respHeader.messageHeader.messageTypeAndChunkType = UA_MESSAGETYPE_OPN + UA_CHUNKTYPE_FINAL;
    respHeader.messageHeader.messageSize = (UA_UInt32)tmpPos;
    respHeader.secureChannelId = p.securityToken.channelId;
    tmpPos = 0;
    UA_SecureConversationMessageHeader_encodeBinary(&respHeader, &resp_msg, &tmpPos);
    resp_msg.length = respHeader.messageHeader.messageSize;
    connection->send(connection, &resp_msg);

    /* Clean up */
    UA_OpenSecureChannelResponse_deleteMembers(&p);
    UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
}